

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_is_sct_list_valid(CBS *contents)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  CBS sct_list;
  CBS copy;
  CBS sct;
  
  copy.data = contents->data;
  copy.len = contents->len;
  iVar1 = CBS_get_u16_length_prefixed(&copy,&sct_list);
  bVar3 = false;
  if ((iVar1 != 0) && (bVar3 = false, copy.len == 0)) {
    if (sct_list.len == 0) {
      bVar3 = false;
    }
    else {
      sVar2 = 1;
      do {
        bVar3 = sVar2 == 0;
        if (bVar3) {
          return bVar3;
        }
        iVar1 = CBS_get_u16_length_prefixed(&sct_list,&sct);
        if (iVar1 == 0) {
          return bVar3;
        }
        sVar2 = sct_list.len;
      } while (sct.len != 0);
    }
  }
  return bVar3;
}

Assistant:

bool ssl_is_sct_list_valid(const CBS *contents) {
  // Shallow parse the SCT list for sanity. By the RFC
  // (https://tools.ietf.org/html/rfc6962#section-3.3) neither the list nor any
  // of the SCTs may be empty.
  CBS copy = *contents;
  CBS sct_list;
  if (!CBS_get_u16_length_prefixed(&copy, &sct_list) || CBS_len(&copy) != 0 ||
      CBS_len(&sct_list) == 0) {
    return false;
  }

  while (CBS_len(&sct_list) > 0) {
    CBS sct;
    if (!CBS_get_u16_length_prefixed(&sct_list, &sct) || CBS_len(&sct) == 0) {
      return false;
    }
  }

  return true;
}